

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O1

uint8_t __thiscall m6502::ABY(m6502 *this)

{
  ushort uVar1;
  uint uVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  size_t in_RCX;
  uint uVar5;
  
  uVar1 = this->pc;
  this->pc = uVar1 + 1;
  sVar3 = read(this,(uint)uVar1,(void *)0x0,in_RCX);
  uVar1 = this->pc;
  this->pc = uVar1 + 1;
  sVar4 = read(this,(uint)uVar1,(void *)0x0,in_RCX);
  uVar2 = ((uint)sVar4 & 0xff) * 0x100;
  uVar5 = (uint)this->y + ((uint)sVar3 & 0xff | uVar2);
  this->addrAbs = (uint16_t)uVar5;
  return (uVar5 & 0xff00) != uVar2;
}

Assistant:

uint8_t ABY()
  {
    uint16_t lo = read(pc++);
    uint16_t hi = read(pc++);
    addrAbs = ((hi << 8) | lo) + y;
    // if page changed, need an additional clock cycle
    if ((addrAbs & 0xFF00u) != (hi << 8))
    {
      return 1;
    }
    return 0;
  }